

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::ARRAY
                  (Value *__return_storage_ptr__,LogicalType *child_type,
                  vector<duckdb::Value,_true> *values)

{
  pointer pVVar1;
  Value *val;
  pointer this;
  vector<duckdb::Value,_true> *__range1;
  optional_idx local_90;
  LogicalType local_88;
  Value local_70;
  
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value(__return_storage_ptr__,&local_88);
  LogicalType::~LogicalType(&local_88);
  optional_idx::optional_idx
            (&local_90,
             (long)(values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start >> 6);
  LogicalType::ARRAY(&local_70.type_,child_type,local_90);
  LogicalType::operator=(&__return_storage_ptr__->type_,&local_70.type_);
  LogicalType::~LogicalType(&local_70.type_);
  pVVar1 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start; this != pVVar1; this = this + 1) {
    DefaultCastAs(&local_70,this,child_type,false);
    operator=(this,&local_70);
    ~Value(&local_70);
  }
  make_shared_ptr<duckdb::NestedValueInfo,duckdb::vector<duckdb::Value,true>>
            ((vector<duckdb::Value,_true> *)&local_70);
  shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::NestedValueInfo,_0>
            (&__return_storage_ptr__->value_info_,
             (shared_ptr<duckdb::NestedValueInfo,_true> *)&local_70);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.type_.type_info_);
  __return_storage_ptr__->is_null = false;
  return __return_storage_ptr__;
}

Assistant:

Value Value::ARRAY(const LogicalType &child_type, vector<Value> values) {
	Value result;
	result.type_ = LogicalType::ARRAY(child_type, values.size());
	for (auto &val : values) {
		val = val.DefaultCastAs(child_type);
	}
	result.value_info_ = make_shared_ptr<NestedValueInfo>(std::move(values));
	result.is_null = false;
	return result;
}